

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildObject(ObjectModelBuilder *this,value *value,Object *parent,Class *clazz)

{
  Property *pPVar1;
  pointer pvVar2;
  undefined1 auVar3 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  __type _Var6;
  bool bVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *this_00;
  Object *pOVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  double *pdVar11;
  Value *this_01;
  string *psVar12;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *this_02;
  const_iterator cVar13;
  Binding *__p;
  mapped_type *this_03;
  array *paVar14;
  ostream *poVar15;
  Class *clazz_00;
  string *psVar16;
  ObjectModelBuilder *pOVar17;
  Property *pPVar18;
  _Rb_tree_header *p_Var19;
  _Base_ptr x;
  _Rb_tree_header *p_Var20;
  pointer x_00;
  undefined8 uVar21;
  undefined1 local_138 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  member;
  string typeName;
  string id;
  undefined1 local_c0 [8];
  Property classProperty;
  undefined1 local_68 [8];
  shared_ptr<Binding> binding;
  Object *local_48;
  Object *instance;
  _Base_ptr local_38;
  
  classProperty.type.field_2._8_8_ = parent;
  binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (value->type_ != 5) {
    poVar15 = std::operator<<((ostream *)&std::cerr,"error: \'root\' entry in class=\'");
    poVar15 = std::operator<<(poVar15,(string *)clazz);
    poVar15 = std::operator<<(poVar15,"\' is not a JSON object...");
    std::endl<char,std::char_traits<char>>(poVar15);
    return false;
  }
  instance = (Object *)clazz;
  this_00 = &picojson::value::
             get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                       (value)->_M_t;
  findStringInObject((string *)&member.second.u_,(object *)this_00,"class");
  if (typeName._M_dataplus._M_p == (pointer)0x0) {
    poVar15 = std::operator<<((ostream *)&std::cerr,
                              "error: object has empty or missing \'class\' in class=\'");
    poVar15 = std::operator<<(poVar15,(string *)instance);
    poVar15 = std::operator<<(poVar15,"\', ");
    std::endl<char,std::char_traits<char>>(poVar15);
    bVar5 = false;
    goto LAB_001125c3;
  }
  findStringInObject((string *)local_c0,(object *)this_00,"id");
  uniqueIdentifier((string *)((long)&typeName.field_2 + 8),
                   (ObjectModelBuilder *)
                   binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   ,clazz_00,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  pOVar8 = (Object *)operator_new(0x78);
  (pOVar8->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar8->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar8->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pOVar8->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pOVar8->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pOVar8->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pOVar8->propertyValues)._M_t._M_impl = 0;
  *(undefined8 *)&(pOVar8->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pOVar8->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pOVar8->id).field_2 + 8) = 0;
  (pOVar8->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pOVar8->id)._M_dataplus._M_p = (pointer)0x0;
  (pOVar8->id)._M_string_length = 0;
  pOVar8->clazz = (Class *)0x0;
  pOVar8->parent = (Object *)0x0;
  Object::Object(pOVar8);
  pOVar8->parent = (Object *)classProperty.type.field_2._8_8_;
  local_48 = pOVar8;
  std::__cxx11::string::_M_assign((string *)&pOVar8->id);
  _Var4 = binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                  *)(binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 6),(key_type *)&member.second.u_);
  if (iVar9._M_node == (_Base_ptr)&_Var4._M_pi[6]._M_use_count) {
    poVar15 = std::operator<<((ostream *)&std::cerr,"error: unknown class=");
    poVar15 = std::operator<<(poVar15,(string *)&member.second.u_.boolean_);
    poVar15 = std::operator<<(poVar15,", for object id=");
    poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
    std::endl<char,std::char_traits<char>>(poVar15);
    goto LAB_001125b5;
  }
  pOVar8->clazz = *(Class **)(iVar9._M_node + 2);
  p_Var20 = &(this_00->_M_impl).super__Rb_tree_header;
  for (p_Var10 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != p_Var20; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10))
  {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            *)local_138,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            *)(p_Var10 + 1));
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,"children");
    if (((!bVar5) &&
        (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_138,"id"), !bVar5)) &&
       (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_138,"class"), pOVar8 = local_48, !bVar5)) {
      pPVar18 = (local_48->clazz->properties).
                super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar1 = (local_48->clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pPVar18 == pPVar1) {
          poVar15 = std::operator<<((ostream *)&std::cerr,"error: object id=");
          poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
          poVar15 = std::operator<<(poVar15,", class=");
          poVar15 = std::operator<<(poVar15,(string *)&member.second.u_.boolean_);
          poVar15 = std::operator<<(poVar15,", unknown property=");
          poVar15 = std::operator<<(poVar15,(string *)local_138);
          std::endl<char,std::char_traits<char>>(poVar15);
          goto LAB_0011255f;
        }
        Property::Property((Property *)local_c0,pPVar18);
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&classProperty,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_138);
        Property::~Property((Property *)local_c0);
        pPVar18 = pPVar18 + 1;
      } while (!_Var6);
      if (member.first.field_2._8_4_ == 5) {
        this_02 = &picojson::value::
                   get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                             ((value *)((long)&member.first.field_2 + 8))->_M_t;
        std::__cxx11::string::string((string *)local_c0,"bind",(allocator *)local_68);
        cVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 ::find(this_02,(key_type *)local_c0);
        std::__cxx11::string::~string((string *)local_c0);
        std::__cxx11::string::string((string *)local_c0,"to",(allocator *)local_68);
        local_38 = (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   ::find(this_02,(key_type *)local_c0);
        std::__cxx11::string::~string((string *)local_c0);
        p_Var19 = &(this_02->_M_impl).super__Rb_tree_header;
        if ((((_Rb_tree_header *)cVar13._M_node == p_Var19) || (cVar13._M_node[2]._M_color != 3)) ||
           (((_Rb_tree_header *)local_38 == p_Var19 || (1 < *(int *)(local_38 + 2) - 3U)))) {
          poVar15 = std::operator<<((ostream *)&std::cerr,"error: malformed binding in object id=");
          poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
          poVar15 = std::operator<<(poVar15,", class=");
          poVar15 = std::operator<<(poVar15,(string *)&member.second.u_.boolean_);
          poVar15 = std::operator<<(poVar15,", property=");
          poVar15 = std::operator<<(poVar15,(string *)local_138);
          std::endl<char,std::char_traits<char>>(poVar15);
LAB_0011255f:
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                   *)local_138);
          goto LAB_001125b5;
        }
        __p = (Binding *)operator_new(0x38);
        (__p->expression).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(__p->expression).field_2 + 8) = 0;
        (__p->expression)._M_dataplus._M_p = (pointer)&(__p->expression).field_2;
        (__p->expression)._M_string_length = 0;
        (__p->dependencies).
        super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__p->dependencies).
        super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__p->dependencies).
        super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__shared_ptr<Binding,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Binding,void>
                  ((__shared_ptr<Binding,(__gnu_cxx::_Lock_policy)2> *)local_68,__p);
        auVar3 = local_68;
        pOVar17 = (ObjectModelBuilder *)(local_38 + 2);
        if (*(int *)pOVar17 == 3) {
          local_38 = (_Base_ptr)pOVar17;
          psVar12 = picojson::value::get<std::__cxx11::string>((value *)pOVar17);
          bVar5 = buildBindingDependency(pOVar17,(Binding *)auVar3,psVar12,pOVar8,(Class *)instance)
          ;
          if (!bVar5) {
            poVar15 = std::operator<<((ostream *)&std::cerr,"error: malformed binding dependency=");
            psVar12 = picojson::value::get<std::__cxx11::string>((value *)local_38);
            poVar15 = std::operator<<(poVar15,(string *)psVar12);
            poVar15 = std::operator<<(poVar15,", in object id=");
            poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
            poVar15 = std::operator<<(poVar15,", class=");
            poVar15 = std::operator<<(poVar15,(string *)&member.second.u_.boolean_);
            poVar15 = std::operator<<(poVar15,", property=");
            poVar15 = std::operator<<(poVar15,(string *)local_138);
            std::endl<char,std::char_traits<char>>(poVar15);
LAB_00112918:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&binding);
            goto LAB_0011255f;
          }
        }
        else {
          paVar14 = picojson::value::
                    get<std::vector<picojson::value,std::allocator<picojson::value>>>
                              ((value *)pOVar17);
          local_38 = (_Base_ptr)
                     (paVar14->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          for (x = (_Base_ptr)
                   (paVar14->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                   _M_impl.super__Vector_impl_data._M_start; x != local_38;
              x = (_Base_ptr)&x->_M_left) {
            picojson::value::value((value *)local_c0,(value *)x);
            auVar3 = local_68;
            if (local_c0._0_4_ != 3) {
              poVar15 = std::operator<<((ostream *)&std::cerr,
                                        "error: binding dependency needs to be a JSON string, id=");
              poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
              poVar15 = std::operator<<(poVar15,", property=");
              poVar15 = std::operator<<(poVar15,(string *)local_138);
              poVar15 = std::operator<<(poVar15,", class=");
              psVar16 = (string *)&member.second.u_;
LAB_001128fc:
              poVar15 = std::operator<<(poVar15,psVar16);
              std::endl<char,std::char_traits<char>>(poVar15);
              picojson::value::~value((value *)local_c0);
              goto LAB_00112918;
            }
            pOVar17 = (ObjectModelBuilder *)local_c0;
            psVar12 = picojson::value::get<std::__cxx11::string>((value *)local_c0);
            bVar5 = buildBindingDependency
                              (pOVar17,(Binding *)auVar3,psVar12,pOVar8,(Class *)instance);
            if (!bVar5) {
              poVar15 = std::operator<<((ostream *)&std::cerr,"error: malformed binding dependency="
                                       );
              psVar12 = picojson::value::get<std::__cxx11::string>((value *)local_c0);
              poVar15 = std::operator<<(poVar15,(string *)psVar12);
              poVar15 = std::operator<<(poVar15,", in object id=");
              poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
              poVar15 = std::operator<<(poVar15,", class=");
              poVar15 = std::operator<<(poVar15,(string *)&member.second.u_.boolean_);
              poVar15 = std::operator<<(poVar15,", property=");
              psVar16 = (string *)local_138;
              goto LAB_001128fc;
            }
            picojson::value::~value((value *)local_c0);
          }
        }
        picojson::value::get<std::__cxx11::string>((value *)(cVar13._M_node + 2));
        std::__cxx11::string::_M_assign((string *)local_68);
        Value::binding((Value *)local_c0,(shared_ptr<Binding> *)local_68);
        this_03 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                  ::operator[](&pOVar8->propertyValues,(key_type *)local_138);
        Value::operator=(this_03,(Value *)local_c0);
        Value::~Value((Value *)local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&binding);
      }
      else {
        if (member.first.field_2._8_4_ == 3) {
          psVar12 = picojson::value::get<std::__cxx11::string>
                              ((value *)((long)&member.first.field_2 + 8));
          Value::string((Value *)local_c0,psVar12);
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                    ::operator[](&pOVar8->propertyValues,(key_type *)local_138);
        }
        else {
          if (member.first.field_2._8_4_ != 2) goto LAB_0011217f;
          pdVar11 = picojson::value::get<double>((value *)((long)&member.first.field_2 + 8));
          classProperty.name.field_2._M_allocated_capacity = (size_type)*pdVar11;
          local_c0 = (undefined1  [8])&classProperty.name;
          classProperty.clazz = (Class *)0x0;
          classProperty.name._M_dataplus._M_p._0_1_ = 0;
          classProperty.name.field_2._8_8_ = 0;
          classProperty.type._M_dataplus._M_p = (pointer)0x0;
          classProperty.type._M_string_length._0_4_ = 1;
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                    ::operator[](&pOVar8->propertyValues,(key_type *)local_138);
        }
        Value::operator=(this_01,(Value *)local_c0);
        Value::~Value((Value *)local_c0);
      }
    }
LAB_0011217f:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
             *)local_138);
  }
  std::__cxx11::string::string((string *)local_c0,"children",(allocator *)local_138);
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           ::find(this_00,(key_type *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  if ((_Rb_tree_header *)cVar13._M_node == p_Var20) {
LAB_001126b1:
    if (*(char *)((long)&binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi[9]._vptr__Sp_counted_base + 4) == '\x01') {
      local_c0 = (undefined1  [8])&classProperty.name;
      classProperty.clazz = (Class *)0x0;
      classProperty.name._M_dataplus._M_p._0_1_ = 0;
      for (uVar21 = classProperty.type.field_2._8_8_; uVar21 != 0; uVar21 = *(long *)(uVar21 + 8)) {
        std::__cxx11::string::append(local_c0);
      }
      poVar15 = std::operator<<((ostream *)&std::cerr," - object: ");
      poVar15 = std::operator<<(poVar15,(string *)local_c0);
      poVar15 = std::operator<<(poVar15,"id=");
      poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
      poVar15 = std::operator<<(poVar15,", class=");
      poVar15 = std::operator<<(poVar15,(string *)&member.second.u_.boolean_);
      poVar15 = std::operator<<(poVar15,", children=");
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::endl<char,std::char_traits<char>>(poVar15);
      std::__cxx11::string::~string((string *)local_c0);
    }
    if (classProperty.type.field_2._8_8_ == 0) {
      instance[1].children.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_48;
      bVar5 = true;
    }
    else {
      bVar5 = true;
      std::vector<Object_*,_std::allocator<Object_*>_>::push_back
                ((vector<Object_*,_std::allocator<Object_*>_> *)
                 (classProperty.type.field_2._8_8_ + 0x60),&local_48);
    }
  }
  else {
    if (cVar13._M_node[2]._M_color == 5) {
      bVar5 = buildObject((ObjectModelBuilder *)
                          binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,(value *)(cVar13._M_node + 2),local_48,(Class *)instance
                         );
      if (bVar5) goto LAB_001126b1;
    }
    else {
      if (cVar13._M_node[2]._M_color == 4) {
        paVar14 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                            ((value *)(cVar13._M_node + 2));
        x_00 = (paVar14->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
               _M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (paVar14->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        bVar5 = false;
        do {
          if (x_00 == pvVar2) goto LAB_001126b1;
          picojson::value::value((value *)local_c0,x_00);
          bVar7 = buildObject((ObjectModelBuilder *)
                              binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,(value *)local_c0,local_48,(Class *)instance);
          picojson::value::~value((value *)local_c0);
          x_00 = x_00 + 1;
        } while (bVar7);
        goto LAB_001125b7;
      }
      poVar15 = std::operator<<((ostream *)&std::cerr,"error: object id=");
      poVar15 = std::operator<<(poVar15,(string *)(typeName.field_2._M_local_buf + 8));
      poVar15 = std::operator<<(poVar15," of class=");
      poVar15 = std::operator<<(poVar15,(string *)&member.second.u_.boolean_);
      poVar15 = std::operator<<(poVar15,", has invalid children, must be JSON array or object");
      std::endl<char,std::char_traits<char>>(poVar15);
    }
LAB_001125b5:
    bVar5 = false;
  }
LAB_001125b7:
  std::__cxx11::string::~string((string *)(typeName.field_2._M_local_buf + 8));
LAB_001125c3:
  std::__cxx11::string::~string((string *)&member.second.u_.boolean_);
  return bVar5;
}

Assistant:

bool ObjectModelBuilder::buildObject(const picojson::value &value, Object *parent, Class *clazz)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: 'root' entry in class='" << clazz->name << "' is not a JSON object..." << std::endl;
        return false;
    }

    const picojson::object &object = value.get<picojson::object>();

    std::string typeName = findStringInObject(object, "class");
    if (typeName.empty()) {
        std::cerr << "error: object has empty or missing 'class' in class='" << clazz->name << "', " << std::endl;
        return false;
    }

    std::string id = uniqueIdentifier(clazz, (findStringInObject(object, "id")));

    Object *instance = new Object();
    instance->parent = parent;
    instance->id = id;

    auto classIt = m_classes.find(typeName);
    if (classIt == m_classes.end()) {
        std::cerr << "error: unknown class=" << typeName << ", for object id=" << id << std::endl;
        return false;
    }
    instance->clazz = classIt->second;

    // Parse out the properties and values..
    for (auto member : object) {
        const std::string &key = member.first;

        // These are special cased above and below
        if (key == "children" || key == "id" || key == "class")
            continue;

        // Verify that the class in question actually has the property
        bool exists = false;
        for (auto classProperty : instance->clazz->properties) {
            if (classProperty.name == key) {
                exists = true;
                break;
            }
        }
        if (!exists) {
            std::cerr << "error: object id=" << id << ", class=" << typeName << ", unknown property=" << key << std::endl;
            return false;
        }

        const picojson::value &propertyValue = member.second;
        if (propertyValue.is<double>()) {
            instance->propertyValues[key] = Value::number(propertyValue.get<double>());
        } else if (propertyValue.is<std::string>()) {
            instance->propertyValues[key] = Value::string(propertyValue.get<std::string>());
        } else if (propertyValue.is<picojson::object>()) {
            const picojson::object &binding = propertyValue.get<picojson::object>();
            auto bind = binding.find("bind");
            auto to = binding.find("to");

            if (bind != binding.end() && bind->second.is<std::string>()
                && to != binding.end() && (to->second.is<std::string>() || to->second.is<picojson::array>())) {
                std::shared_ptr<Binding> binding(new Binding());
                if (to->second.is<std::string>()) {
                    if (!buildBindingDependency(binding.get(), to->second.get<std::string>(), instance, clazz)) {
                        std::cerr << "error: malformed binding dependency=" << to->second.get<std::string>() << ", in object id="
                                  << id << ", class=" << typeName << ", property=" << key << std::endl;
                        return false;
                    }
                } else {
                    for (auto i : to->second.get<picojson::array>()) {
                        if (!i.is<std::string>()) {
                            std::cerr << "error: binding dependency needs to be a JSON string, id=" << id << ", property="
                                      << key << ", class=" << typeName << std::endl;
                            return false;
                        }
                        if (!buildBindingDependency(binding.get(), i.get<std::string>(), instance, clazz)) {
                            std::cerr << "error: malformed binding dependency=" << i.get<std::string>() << ", in object id="
                                      << id << ", class=" << typeName << ", property=" << key << std::endl;
                            return false;
                        }
                    }
                }
                binding->expression = bind->second.get<std::string>();
                instance->propertyValues[key] = Value::binding(binding);
            } else {
                std::cerr << "error: malformed binding in object id=" << id << ", class=" << typeName
                          << ", property=" << key << std::endl;
                return false;
            }
        }
    }

    // Recursively traverse the children..
    auto childrenIt = object.find("children");
    if (childrenIt != object.end()) {
        const picojson::value &children = childrenIt->second;
        if (children.is<picojson::array>()) {
            for (auto child : children.get<picojson::array>())
                if (!buildObject(child, instance, clazz))
                    return false;
        } else if (children.is<picojson::object>()) {
            if (!buildObject(children, instance, clazz))
                return false;
        } else {
            std::cerr << "error: object id=" << id << " of class=" << typeName << ", has invalid children, must be JSON array or object" << std::endl;
            return false;
        }
    }

    if (m_verbose) {
        std::string padding;
        Object *p = parent;
        while (p) {
            padding += "  ";
            p = p->parent;
        }
        std::cerr << " - object: " << padding << "id=" << id << ", class=" << typeName << ", children=" << instance->children.size() << std::endl;
    }

    if (parent)
        parent->children.push_back(instance);
    else
        clazz->root = instance;

    return true;
}